

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::GroupSegPlanesSimple(FNodeBuilder *this)

{
  int iVar1;
  uint uVar2;
  FPrivSeg *pFVar3;
  FSimpleLine *pFVar4;
  FPrivVert *pFVar5;
  FSimpleLine *pline;
  FPrivSeg *seg;
  int i;
  FNodeBuilder *this_local;
  
  uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
  TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Resize(&this->Planes,uVar2);
  seg._4_4_ = 0;
  while( true ) {
    uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
    if ((int)uVar2 <= seg._4_4_) break;
    pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(long)seg._4_4_);
    pFVar4 = TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::operator[]
                       (&this->Planes,(long)seg._4_4_);
    pFVar3->next = seg._4_4_ + 1;
    pFVar3->hashnext = (FPrivSeg *)0x0;
    pFVar3->planenum = seg._4_4_;
    pFVar3->planefront = true;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar3->v1);
    pFVar4->x = (pFVar5->super_FSimpleVert).x;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar3->v1);
    pFVar4->y = (pFVar5->super_FSimpleVert).y;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar3->v2);
    iVar1 = (pFVar5->super_FSimpleVert).x;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar3->v1);
    pFVar4->dx = iVar1 - (pFVar5->super_FSimpleVert).x;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar3->v2);
    iVar1 = (pFVar5->super_FSimpleVert).y;
    pFVar5 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar3->v1);
    pFVar4->dy = iVar1 - (pFVar5->super_FSimpleVert).y;
    seg._4_4_ = seg._4_4_ + 1;
  }
  pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Last(&this->Segs);
  pFVar3->next = 0xffffffff;
  uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
  TArray<unsigned_char,_unsigned_char>::Reserve(&this->PlaneChecked,uVar2 + 7 >> 3);
  return;
}

Assistant:

void FNodeBuilder::GroupSegPlanesSimple()
{
	Planes.Resize(Segs.Size());
	for (int i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		FSimpleLine *pline = &Planes[i];
		seg->next = i+1;
		seg->hashnext = NULL;
		seg->planenum = i;
		seg->planefront = true;
		pline->x = Vertices[seg->v1].x;
		pline->y = Vertices[seg->v1].y;
		pline->dx = Vertices[seg->v2].x - Vertices[seg->v1].x;
		pline->dy = Vertices[seg->v2].y - Vertices[seg->v1].y;
	}
	Segs.Last().next = DWORD_MAX;
	PlaneChecked.Reserve((Segs.Size() + 7) / 8);
}